

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressDXT.cpp
# Opt level: O3

void __thiscall
nv::SlowCompressor::compressDXT1a
          (SlowCompressor *this,Private *compressionOptions,Private *outputOptions)

{
  OutputHandler *pOVar1;
  ushort uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  BlockDXT1 block;
  ColorBlock rgba;
  WeightedClusterFit fit;
  ColourSet colours;
  anon_union_4_2_12391d8d_for_Color32_0 local_594;
  BlockDXT1 local_590;
  anon_union_4_2_12391d8d_for_Color32_0 local_588;
  undefined4 uStack_584;
  undefined4 uStack_580;
  undefined4 uStack_57c;
  undefined3 uStack_578;
  byte local_575;
  byte local_571;
  byte local_56d;
  byte local_569;
  byte local_565;
  byte local_561;
  byte local_55d;
  byte local_559;
  byte local_555;
  byte local_551;
  byte local_54d;
  byte local_549;
  SlowCompressor *local_548;
  Private *local_540;
  WeightedClusterFit local_538;
  ColourSet local_388;
  
  local_540 = outputOptions;
  uVar4 = Image::width(this->m_image);
  local_548 = this;
  uVar5 = Image::height(this->m_image);
  ColorBlock::ColorBlock((ColorBlock *)&local_588.field_0);
  squish::WeightedClusterFit::WeightedClusterFit(&local_538);
  squish::WeightedClusterFit::SetMetric
            (&local_538,(compressionOptions->colorWeight).m_x,(compressionOptions->colorWeight).m_y,
             (compressionOptions->colorWeight).m_z);
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      if (uVar4 != 0) {
        uVar7 = 0;
        do {
          ColorBlock::init((ColorBlock *)&local_588.field_0,(EVP_PKEY_CTX *)local_548->m_image);
          auVar11._1_4_ = uStack_584;
          auVar11[0] = local_588.field_0.a;
          auVar11._5_4_ = uStack_580;
          auVar11._9_4_ = uStack_57c;
          auVar11._13_3_ = uStack_578;
          auVar10 = psllw(ZEXT116(uStack_584._3_1_),8);
          auVar8._1_7_ = 0;
          auVar8[0] = local_565;
          auVar8[8] = local_565;
          auVar8._9_7_ = 0;
          auVar9._1_3_ = 0;
          auVar9[0] = local_555;
          auVar9[4] = local_555;
          auVar9._5_3_ = 0;
          auVar9[8] = local_555;
          auVar9._9_3_ = 0;
          auVar9[0xc] = local_555;
          auVar9._13_3_ = 0;
          auVar11 = ZEXT116(local_549) << 0x78 |
                    (ZEXT116(local_54d) << 0x70 |
                    (~_DAT_001f8540 & ZEXT116(local_551) << 0x68 |
                    (~_DAT_001f8530 & auVar9 |
                    (~_DAT_001f8520 & ZEXT116(local_559) << 0x58 |
                    (~_DAT_001f8510 & ZEXT116(local_55d) << 0x50 |
                    (~_DAT_001f8500 & ZEXT116(local_561) << 0x48 |
                    (~_DAT_001f84f0 & auVar8 |
                    (~_DAT_001f84e0 & ZEXT116(local_569) << 0x38 |
                    (~_DAT_001f84d0 & ZEXT116(local_56d) << 0x30 |
                    (~_DAT_001f84c0 & ZEXT116(local_571) << 0x28 |
                    (~_DAT_001f84b0 & ZEXT516(CONCAT14(local_575,(uint)local_575)) |
                    (~_DAT_001f84a0 & ZEXT116(uStack_57c._3_1_) << 0x18 |
                    (~_DAT_001f8490 & ZEXT116(uStack_580._3_1_) << 0x10 |
                    (~_DAT_001f8480 & auVar10 | auVar11 & _DAT_001f8480) & _DAT_001f8490) &
                    _DAT_001f84a0) & _DAT_001f84b0) & _DAT_001f84c0) & _DAT_001f84d0) &
                    _DAT_001f84e0) & _DAT_001f84f0) & _DAT_001f8500) & _DAT_001f8510) &
                    _DAT_001f8520) & _DAT_001f8530) & _DAT_001f8540) & _DAT_001f8550) &
                    _DAT_001f8560;
          uVar2 = (ushort)(SUB161(auVar11 >> 7,0) & 1) | (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1
                  | (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar11[0xf] >> 7) << 0xf;
          if (uVar2 == 0xffff) {
            bVar3 = ColorBlock::isSingleColor((ColorBlock *)&local_588.field_0);
            if (bVar3) goto LAB_001cb704;
LAB_001cb6ba:
            squish::ColourSet::ColourSet(&local_388,(u8 *)&local_588.u,0x81,false);
            squish::WeightedClusterFit::SetColourSet(&local_538,&local_388,1);
            squish::ColourFit::Compress(&local_538.super_ColourFit,&local_590);
          }
          else {
            if (uVar2 != 0) goto LAB_001cb6ba;
LAB_001cb704:
            local_594.field_0 = local_588.field_0;
            OptimalCompress::compressDXT1a((Color32 *)&local_594.field_0,&local_590);
          }
          pOVar1 = local_540->outputHandler;
          if (pOVar1 != (OutputHandler *)0x0) {
            (*pOVar1->_vptr_OutputHandler[3])(pOVar1,&local_590,8);
          }
          uVar7 = uVar7 + 4;
        } while (uVar7 < uVar4);
      }
      uVar6 = uVar6 + 4;
    } while (uVar6 < uVar5);
  }
  return;
}

Assistant:

void nv::SlowCompressor::compressDXT1a(const CompressionOptions::Private & compressionOptions, const OutputOptions::Private & outputOptions)
{
	const uint w = m_image->width();
	const uint h = m_image->height();
	
	ColorBlock rgba;
	BlockDXT1 block;

	squish::WeightedClusterFit fit;
	fit.SetMetric(compressionOptions.colorWeight.x(), compressionOptions.colorWeight.y(), compressionOptions.colorWeight.z());

	for (uint y = 0; y < h; y += 4) {
		for (uint x = 0; x < w; x += 4) {
			
			rgba.init(m_image, x, y);
			
			bool anyAlpha = false;
			bool allAlpha = true;
			
			for (uint i = 0; i < 16; i++)
			{
				if (rgba.color(i).a < 128) anyAlpha = true;
				else allAlpha = false;
			}
			
			if ((!anyAlpha && rgba.isSingleColor() || allAlpha))
			{
				OptimalCompress::compressDXT1a(rgba.color(0), &block);
			}
			else
			{
				squish::ColourSet colours((uint8 *)rgba.colors(), squish::kDxt1|squish::kWeightColourByAlpha);
				fit.SetColourSet(&colours, squish::kDxt1);
				fit.Compress(&block);
			}
			
			if (outputOptions.outputHandler != NULL) {
				outputOptions.outputHandler->writeData(&block, sizeof(block));
			}
		}
	}
}